

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgroupbox.cpp
# Opt level: O1

void QGroupBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QArrayData *pQVar7;
  QString *title;
  undefined1 uVar8;
  int iVar9;
  long in_FS_OFFSET;
  undefined1 local_39;
  void *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_39 = *_a[1];
    goto LAB_00413b19;
  case 1:
    local_39 = 0;
LAB_00413b19:
    iVar9 = 0;
LAB_00413b25:
    puStack_30 = &local_39;
    local_38 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar9,&local_38);
    break;
  case 2:
    local_39 = *_a[1];
    iVar9 = 2;
    goto LAB_00413b25;
  case 3:
    setChecked((QGroupBox *)_o,*_a[1]);
    break;
  case 4:
    QGroupBoxPrivate::_q_setChildrenEnabled(*(QGroupBoxPrivate **)(_o + 8),*_a[1]);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_00413a54_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == clicked) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_00413a54_caseD_3;
      }
      if (((code *)*plVar1 == toggled) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_00413a54_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_00413a54_caseD_3;
        goto switchD_00413a54_caseD_1;
      }
    }
    goto switchD_00413a54_caseD_2;
  }
switchD_00413a54_caseD_1:
  if (4 < (uint)_id) goto LAB_00413c48;
  puVar2 = (undefined8 *)*_a;
  switch(_id) {
  case 0:
    lVar3 = *(long *)(_o + 8);
    piVar4 = *(int **)(lVar3 + 600);
    uVar5 = *(undefined8 *)(lVar3 + 0x260);
    uVar6 = *(undefined8 *)(lVar3 + 0x268);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    pQVar7 = (QArrayData *)*puVar2;
    *puVar2 = piVar4;
    puVar2[1] = uVar5;
    puVar2[2] = uVar6;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar7,2,0x10);
      }
    }
    break;
  case 1:
    *(undefined4 *)puVar2 = *(undefined4 *)(*(long *)(_o + 8) + 0x270);
    break;
  case 2:
    uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x278);
    goto LAB_00413c32;
  case 3:
    uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x279);
LAB_00413c32:
    *(undefined1 *)puVar2 = uVar8;
    break;
  case 4:
    if (*(char *)(*(long *)(_o + 8) + 0x279) == '\x01') {
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x27a);
    }
    else {
      uVar8 = 0;
    }
    *(undefined1 *)puVar2 = uVar8;
  }
LAB_00413c48:
  if (_c == WriteProperty) {
switchD_00413a54_caseD_2:
    if ((uint)_id < 5) {
      title = (QString *)*_a;
      switch(_id) {
      case 0:
        setTitle((QGroupBox *)_o,title);
        break;
      case 1:
        *(undefined4 *)(*(long *)(_o + 8) + 0x270) = *(undefined4 *)&(title->d).d;
        QWidget::updateGeometry((QWidget *)_o);
        QWidget::update((QWidget *)_o);
        break;
      case 2:
        setFlat((QGroupBox *)_o,*(bool *)&(title->d).d);
        break;
      case 3:
        setCheckable((QGroupBox *)_o,*(bool *)&(title->d).d);
        break;
      case 4:
        setChecked((QGroupBox *)_o,*(bool *)&(title->d).d);
      }
    }
  }
switchD_00413a54_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGroupBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->clicked(); break;
        case 2: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->d_func()->_q_setChildrenEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::toggled, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 1: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isFlat(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 2: _t->setFlat(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}